

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DoWhileStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DoWhileStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3,Token *args_4,Token *args_5,ExpressionSyntax *args_6,Token *args_7
          ,Token *args_8)

{
  Token whileKeyword;
  Token openParen;
  Token semi;
  DoWhileStatementSyntax *this_00;
  Token *in_RCX;
  Info *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  long in_stack_00000018;
  Token *in_stack_00000020;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  BumpAllocator *in_stack_ffffffffffffff38;
  
  this_00 = (DoWhileStatementSyntax *)
            allocate(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  whileKeyword.info = (Info *)*in_stack_00000008;
  whileKeyword._0_8_ = *(StatementSyntax **)(in_stack_00000018 + 8);
  openParen.info = (Info *)*in_R9;
  openParen._0_8_ = in_stack_00000008[1];
  semi.info = in_R8;
  semi._0_8_ = in_R9;
  slang::syntax::DoWhileStatementSyntax::DoWhileStatementSyntax
            (this_00,(NamedLabelSyntax *)in_stack_00000020->info,
             *(SyntaxList<slang::syntax::AttributeInstanceSyntax> **)in_stack_00000020,
             *in_stack_00000020,*(StatementSyntax **)(in_stack_00000018 + 8),whileKeyword,openParen,
             (ExpressionSyntax *)in_R9[1],*in_RCX,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }